

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void progressbarinit(ProgressData *bar,Configurable *config)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  long num;
  char *endptr;
  char *colp;
  Configurable *config_local;
  ProgressData *bar_local;
  
  colp = (char *)config;
  config_local = (Configurable *)bar;
  memset(bar,0,0x28);
  if ((colp[0x50] & 1U) != 0) {
    config_local->useragent = *(char **)(colp + 0x78);
  }
  endptr = (char *)curl_getenv("COLUMNS");
  if (endptr == (char *)0x0) {
    *(undefined4 *)&config_local->random_file = 0x4f;
    goto LAB_00108854;
  }
  lVar2 = strtol(endptr,(char **)&num,10);
  pcVar1 = endptr;
  if ((char *)num == endptr) {
LAB_00108833:
    *(undefined4 *)&config_local->random_file = 0x4f;
  }
  else {
    sVar3 = strlen(endptr);
    if (((char *)num != pcVar1 + sVar3) || (lVar2 < 1)) goto LAB_00108833;
    *(int *)&config_local->random_file = (int)lVar2;
  }
  curl_free(endptr);
LAB_00108854:
  config_local->egd_file = *(char **)(colp + 0x260);
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct Configurable *config)
{
#ifdef __EMX__
  /* 20000318 mgs */
  int scr_size[2];
#endif
  char *colp;

  memset(bar, 0, sizeof(struct ProgressData));

  /* pass this through to progress function so
   * it can display progress towards total file
   * not just the part that's left. (21-may-03, dbyron) */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

/* TODO: get terminal width through ansi escapes or something similar.
   try to update width when xterm is resized... - 19990617 larsa */
#ifndef __EMX__
  /* 20000318 mgs
   * OS/2 users most likely won't have this env var set, and besides that
   * we're using our own way to determine screen width */
  colp = curlx_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 0))
      bar->width = (int)num;
    else
      bar->width = 79;
    curl_free(colp);
  }
  else
    bar->width = 79;
#else
  /* 20000318 mgs
   * We use this emx library call to get the screen width, and subtract
   * one from what we got in order to avoid a problem with the cursor
   * advancing to the next line if we print a string that is as long as
   * the screen is wide. */

  _scrsize(scr_size);
  bar->width = scr_size[0] - 1;
#endif

  bar->out = config->errors;
}